

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

int Lpk_NodeCutsOneFilter(Lpk_Cut_t *pCuts,int nCuts,Lpk_Cut_t *pCutNew)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  Lpk_Cut_t *pLVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((pCutNew->uSign[0] == 0) && (pCutNew->uSign[1] == 0)) {
    __assert_fail("pCutNew->uSign[0] || pCutNew->uSign[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x16e,"int Lpk_NodeCutsOneFilter(Lpk_Cut_t *, int, Lpk_Cut_t *)");
  }
  if (0 < nCuts) {
    piVar1 = pCuts->pLeaves;
    uVar3 = 0;
    do {
      uVar6 = *(uint *)(pCuts + uVar3) & 0x3f;
      if (uVar6 != 0) {
        pLVar4 = pCuts + uVar3;
        uVar7 = *(uint *)pCutNew & 0x3f;
        if (uVar6 == uVar7) {
          if ((pLVar4->uSign[0] == pCutNew->uSign[0]) && (pLVar4->uSign[1] == pCutNew->uSign[1])) {
            uVar5 = 0;
            if (uVar7 != 0) {
              do {
                if (piVar1[uVar5] != pCutNew->pLeaves[uVar5]) goto LAB_004e4927;
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
              uVar5 = (ulong)uVar7;
            }
LAB_004e4927:
            if ((uint)uVar5 == uVar7) {
              return 1;
            }
          }
        }
        else {
          uVar2 = pCutNew->uSign[0] & pLVar4->uSign[0];
          if (uVar6 < uVar7) {
            if ((uVar2 == pLVar4->uSign[0]) && ((pLVar4->uSign[1] & ~pCutNew->uSign[1]) == 0)) {
              uVar5 = 0;
              do {
                uVar8 = 0;
                do {
                  if (pLVar4->pLeaves[uVar5] == pCutNew->pLeaves[uVar8]) goto LAB_004e497b;
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
                uVar8 = (ulong)uVar7;
LAB_004e497b:
              } while (((uint)uVar8 != uVar7) && (uVar5 = uVar5 + 1, uVar5 != uVar6));
              if ((uint)uVar8 != uVar7) {
                return 1;
              }
            }
          }
          else if ((uVar2 == pCutNew->uSign[0]) && ((pCutNew->uSign[1] & ~pLVar4->uSign[1]) == 0)) {
            if (uVar7 != 0) {
              uVar5 = 0;
              do {
                uVar8 = 0;
                do {
                  if (pCutNew->pLeaves[uVar5] == piVar1[uVar8]) goto LAB_004e49c6;
                  uVar8 = uVar8 + 1;
                } while (uVar6 != uVar8);
                uVar8 = (ulong)uVar6;
LAB_004e49c6:
                if ((uint)uVar8 == uVar6) goto LAB_004e49da;
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar7);
            }
            *(uint *)pLVar4 = *(uint *)(pCuts + uVar3) & 0xffffffc0;
          }
        }
      }
LAB_004e49da:
      uVar3 = uVar3 + 1;
      piVar1 = piVar1 + 0xcd;
    } while (uVar3 != (uint)nCuts);
  }
  return 0;
}

Assistant:

int Lpk_NodeCutsOneFilter( Lpk_Cut_t * pCuts, int nCuts, Lpk_Cut_t * pCutNew )
{
    Lpk_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uSign[0] || pCutNew->uSign[1] );
    // try to find the cut
    for ( i = 0; i < nCuts; i++ )
    {
        pCut = pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;
        if ( pCut->nLeaves == pCutNew->nLeaves )
        {
            if ( pCut->uSign[0] == pCutNew->uSign[0] && pCut->uSign[1] == pCutNew->uSign[1] )
            {
                for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
                    if ( pCut->pLeaves[k] != pCutNew->pLeaves[k] )
                        break;
                if ( k == (int)pCutNew->nLeaves )
                    return 1;
            }
            continue;
        }
        if ( pCut->nLeaves < pCutNew->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCut->uSign[0] )
                continue;
            if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCut->uSign[1] )
                continue;
            // check containment seriously
            if ( Lpk_NodeCutsOneDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCutNew->uSign[0] )
            continue;
        if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCutNew->uSign[1] )
            continue;
        // check containment seriously
        if ( Lpk_NodeCutsOneDominance( pCutNew, pCut ) )
            pCut->nLeaves = 0; // removed
    }
    return 0;
}